

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int doTests(string *name,float ref)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  int iVar6;
  pointer ptVar7;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  pointer local_38;
  
  local_38 = backends_abi_cxx11_.
             super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (backends_abi_cxx11_.
      super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      backends_abi_cxx11_.
      super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    ptVar7 = backends_abi_cxx11_.
             super__Vector_base<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      indk::NeuralNet::doReset(NN);
      lVar2 = std::cout;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x32;
      *(uint *)(freeaddrinfo + *(long *)(lVar2 + -0x18)) =
           *(uint *)(freeaddrinfo + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
      local_98[0] = local_88;
      pcVar1 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + name->_M_string_length);
      std::__cxx11::string::append((char *)local_98);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_98,
                                  (ulong)(ptVar7->
                                         super__Tuple_impl<0UL,_indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).
                                         super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                         ._M_head_impl._M_dataplus._M_p);
      local_78 = &local_68;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_48 = *plVar5;
        lStack_40 = plVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar5;
        local_58 = (long *)*plVar4;
      }
      local_50 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_58,local_50);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      indk::System::setComputeBackend
                (*(int *)&(ptVar7->
                          super__Tuple_impl<0UL,_indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x24,
                 (ptVar7->
                 super__Tuple_impl<0UL,_indk::System::ComputeBackends,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super__Head_base<1UL,_int,_false>._M_head_impl);
      iVar3 = doTest(ref);
      iVar6 = iVar6 + iVar3;
      ptVar7 = ptVar7 + 1;
    } while (ptVar7 != local_38);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return iVar6;
}

Assistant:

int doTests(const std::string& name, float ref) {
    int count = 0;

    for (auto &b: backends) {
        NN -> doReset();
        std::cout << std::setw(50) << std::left << name+" ("+std::get<2>(b)+"): ";
        indk::System::setComputeBackend(std::get<0>(b), std::get<1>(b));
        count += doTest(ref);
    }
    std::cout << std::endl;

    return count;
}